

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

void Aig_TsiStop(Aig_Tsi_t *p)

{
  Aig_MmFixedStop(p->pMem,0);
  Vec_PtrFree(p->vStates);
  free(p->pBins);
  free(p);
  return;
}

Assistant:

void Aig_TsiStop( Aig_Tsi_t * p )
{
    Aig_MmFixedStop( p->pMem, 0 );
    Vec_PtrFree( p->vStates );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}